

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
vkt::shaderexecutor::FloatFunc2::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc2 *this,EvalContext *ctx,Interval *xi,
          Interval *yi)

{
  undefined1 uVar1;
  uint uVar2;
  Interval *pIVar3;
  byte bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_e8;
  double dStack_e0;
  uint local_d0 [2];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  Interval *local_50;
  Interval local_48;
  
  local_48.m_hasNaN = false;
  local_e8 = INFINITY;
  dStack_e0 = -INFINITY;
  local_48.m_lo = INFINITY;
  local_48.m_hi = -INFINITY;
  dVar12 = xi->m_lo;
  local_50 = __return_storage_ptr__;
  if (dVar12 < xi->m_hi || dVar12 == xi->m_hi) {
    dVar13 = yi->m_lo;
    if (dVar13 < yi->m_hi || dVar13 == yi->m_hi) {
      local_b8 = dVar13;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar12,local_b8,local_d0,this,ctx);
      uVar1 = (byte)local_d0[0];
      local_68 = local_c8;
      dStack_60 = dStack_c0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar12,local_b8,local_d0,this,ctx);
      local_78 = (double)CONCAT71(local_78._1_7_,(byte)local_d0[0]);
      local_88 = local_c8;
      dStack_80 = dStack_c0;
      deSetRoundingMode(dVar5);
      local_b8 = yi->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      local_98 = (double)CONCAT71(local_98._1_7_,uVar1);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar12,local_b8,local_d0,this,ctx);
      uVar2 = local_d0[0];
      local_a8 = local_c8;
      dStack_a0 = dStack_c0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar12,local_b8,local_d0,this,ctx);
      dVar13 = dStack_c0;
      dVar12 = local_c8;
      uVar7 = local_d0[0];
      deSetRoundingMode(dVar5);
      dVar10 = (double)(~-(ulong)(local_68 <= local_88) & (ulong)local_88 |
                       (ulong)local_68 & -(ulong)(local_68 <= local_88));
      dVar11 = (double)(~-(ulong)(dStack_80 <= dStack_60) & (ulong)dStack_80 |
                       (ulong)dStack_60 & -(ulong)(dStack_80 <= dStack_60));
      uVar7 = uVar7 & 0xff;
      if ((uVar2 & 1) != 0) {
        uVar7 = 1;
      }
      if (((local_98._0_1_ | local_78._0_1_) & 1) != 0) {
        uVar7 = 1;
      }
      uVar8 = -(ulong)(local_a8 <= dVar12);
      uVar9 = -(ulong)(dVar13 <= dStack_a0);
      dVar12 = (double)(~uVar8 & (ulong)dVar12 | (ulong)local_a8 & uVar8);
      dVar13 = (double)(~uVar9 & (ulong)dVar13 | (ulong)dStack_a0 & uVar9);
      uVar8 = -(ulong)(dVar10 <= dVar12);
      uVar9 = -(ulong)(dVar13 <= dVar11);
      dVar12 = (double)(~uVar8 & (ulong)dVar12 | (ulong)dVar10 & uVar8);
      dVar13 = (double)(~uVar9 & (ulong)dVar13 | (ulong)dVar11 & uVar9);
    }
    else {
      dVar12 = INFINITY;
      dVar13 = -INFINITY;
      uVar7 = 0;
    }
    bVar6 = yi->m_hasNaN;
    if ((bool)bVar6 == true) {
      dVar12 = (double)((ulong)dVar12 & -(ulong)(dVar12 <= INFINITY) |
                       ~-(ulong)(dVar12 <= INFINITY) & 0x7ff0000000000000);
      dVar13 = (double)((ulong)dVar13 & -(ulong)(-INFINITY <= dVar13) |
                       ~-(ulong)(-INFINITY <= dVar13) & 0xfff0000000000000);
      uVar7 = 1;
    }
    dVar10 = yi->m_lo;
    if (dVar10 < yi->m_hi || dVar10 == yi->m_hi) {
      dVar11 = xi->m_hi;
      local_b8 = dVar10;
      local_68 = dVar12;
      dStack_60 = dVar13;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b8,local_d0,this,ctx);
      bVar6 = (byte)local_d0[0];
      local_78 = local_c8;
      dStack_70 = dStack_c0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b8,local_d0,this,ctx);
      local_88 = (double)CONCAT71(local_88._1_7_,(byte)local_d0[0]);
      local_98 = local_c8;
      dStack_90 = dStack_c0;
      deSetRoundingMode(dVar5);
      local_b8 = yi->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b8,local_d0,this,ctx);
      uVar2 = local_d0[0];
      local_a8 = local_c8;
      dStack_a0 = dStack_c0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b8,local_d0,this,ctx);
      dVar13 = dStack_c0;
      dVar12 = local_c8;
      bVar4 = (byte)local_d0[0];
      deSetRoundingMode(dVar5);
      dVar10 = (double)(~-(ulong)(local_78 <= local_98) & (ulong)local_98 |
                       (ulong)local_78 & -(ulong)(local_78 <= local_98));
      dVar11 = (double)(~-(ulong)(dStack_90 <= dStack_70) & (ulong)dStack_90 |
                       (ulong)dStack_70 & -(ulong)(dStack_90 <= dStack_70));
      if ((uVar2 & 1) != 0) {
        bVar4 = 1;
      }
      uVar8 = -(ulong)(local_a8 <= dVar12);
      uVar9 = -(ulong)(dVar13 <= dStack_a0);
      if (((bVar6 | local_88._0_1_) & 1) != 0) {
        bVar4 = 1;
      }
      dVar12 = (double)(~uVar8 & (ulong)dVar12 | (ulong)local_a8 & uVar8);
      dVar13 = (double)(~uVar9 & (ulong)dVar13 | (ulong)dStack_a0 & uVar9);
      uVar8 = -(ulong)(dVar10 <= dVar12);
      uVar9 = -(ulong)(dVar13 <= dVar11);
      dVar10 = (double)(~uVar8 & (ulong)dVar12 | (ulong)dVar10 & uVar8);
      dVar11 = (double)(~uVar9 & (ulong)dVar13 | (ulong)dVar11 & uVar9);
      bVar6 = yi->m_hasNaN;
      dVar12 = local_68;
      dVar13 = dStack_60;
    }
    else {
      dVar10 = INFINITY;
      dVar11 = -INFINITY;
      bVar4 = 0;
    }
    if ((bVar6 & 1) != 0) {
      dVar10 = (double)((ulong)dVar10 & -(ulong)(dVar10 <= INFINITY) |
                       ~-(ulong)(dVar10 <= INFINITY) & 0x7ff0000000000000);
      dVar11 = (double)((ulong)dVar11 & -(ulong)(-INFINITY <= dVar11) |
                       ~-(ulong)(-INFINITY <= dVar11) & 0xfff0000000000000);
      bVar4 = 1;
    }
    bVar6 = 1;
    if ((uVar7 & 1) == 0) {
      bVar6 = bVar4;
    }
    local_e8 = (double)(~-(ulong)(dVar12 <= dVar10) & (ulong)dVar10 |
                       (ulong)dVar12 & -(ulong)(dVar12 <= dVar10));
    dStack_e0 = (double)(~-(ulong)(dVar11 <= dVar13) & (ulong)dVar11 |
                        (ulong)dVar13 & -(ulong)(dVar11 <= dVar13));
  }
  else {
    bVar6 = 0;
  }
  if (xi->m_hasNaN == true) {
    local_e8 = (double)((ulong)local_e8 & -(ulong)(local_e8 <= INFINITY) |
                       ~-(ulong)(local_e8 <= INFINITY) & 0x7ff0000000000000);
    dStack_e0 = (double)((ulong)dStack_e0 & -(ulong)(-INFINITY <= dStack_e0) |
                        ~-(ulong)(-INFINITY <= dStack_e0) & 0xfff0000000000000);
    bVar6 = 1;
  }
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(local_d0,this,ctx,xi,yi);
  bVar4 = 1;
  if ((bVar6 & 1) == 0) {
    bVar4 = (byte)local_d0[0];
  }
  local_b8 = (double)(~-(ulong)(local_e8 <= local_c8) & (ulong)local_c8 |
                     -(ulong)(local_e8 <= local_c8) & (ulong)local_e8);
  dStack_b0 = dStack_e0;
  dVar12 = (double)(~-(ulong)(dStack_c0 <= dStack_e0) & (ulong)dStack_c0 |
                   (ulong)dStack_e0 & -(ulong)(dStack_c0 <= dStack_e0));
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(local_d0,this);
  pIVar3 = local_50;
  if (INFINITY <= local_c8) {
    local_c8 = INFINITY;
  }
  if (dStack_c0 <= -INFINITY) {
    dStack_c0 = -INFINITY;
  }
  local_48.m_lo =
       (double)(~-(ulong)(local_c8 <= local_b8) & (ulong)local_c8 |
               -(ulong)(local_c8 <= local_b8) & (ulong)local_b8);
  uVar8 = -(ulong)(dVar12 <= dStack_c0);
  local_48.m_hi = (double)(~uVar8 & (ulong)dStack_c0 | uVar8 & (ulong)dVar12);
  local_48.m_hasNaN = (bool)bVar4;
  tcu::FloatFormat::convert(local_50,&ctx->format,&local_48);
  return pIVar3;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi) const
	{
		Interval reti;

		TCU_INTERVAL_APPLY_MONOTONE2(reti, x, xi, y, yi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y)));
		reti |= innerExtrema(ctx, xi, yi);
		reti &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(reti);
	}